

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllMatch.h
# Opt level: O2

void __thiscall
oout::AllMatch::AllMatch<oout::Match_const,oout::ContainMatch>
          (AllMatch *this,shared_ptr<const_oout::Match> *match1,
          shared_ptr<const_oout::Match> *matches,shared_ptr<oout::ContainMatch> *matches_1)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Match>_> __l;
  allocator_type local_69;
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>
  local_68;
  __shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<oout::Match_const,(__gnu_cxx::_Lock_policy)2> local_30 [16];
  
  std::__shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&match1->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&matches->super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Match_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainMatch,void>
            (local_30,&matches_1->super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>
            );
  __l._M_len = 3;
  __l._M_array = (iterator)&local_50;
  std::
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>::
  vector(&local_68,__l,&local_69);
  AllMatch(this,&local_68);
  std::
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>::
  ~vector(&local_68);
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_50._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

explicit AllMatch(
		const std::shared_ptr<const Match> &match1,
		const std::shared_ptr<T> & ... matches
	) : AllMatch(std::vector<std::shared_ptr<const Match>>{
		match1, matches...
	    })
	{
	}